

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_upsert.cpp
# Opt level: O0

OnConflictAction duckdb::TransformOnConflictAction(PGOnConflictClause *on_conflict)

{
  int iVar1;
  InternalException *this;
  long in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [47];
  OnConflictAction local_1;
  
  if (in_RDI == 0) {
    local_1 = THROW;
  }
  else {
    iVar1 = *(int *)(in_RDI + 4);
    if (iVar1 == 0) {
      local_1 = THROW;
    }
    else if (iVar1 == 1) {
      local_1 = NOTHING;
    }
    else {
      if (iVar1 != 2) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_30,"Type not implemented for OnConflictAction",&local_31);
        InternalException::InternalException(this,in_stack_ffffffffffffff98);
        __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
      }
      local_1 = UPDATE;
    }
  }
  return local_1;
}

Assistant:

OnConflictAction TransformOnConflictAction(duckdb_libpgquery::PGOnConflictClause *on_conflict) {
	if (!on_conflict) {
		return OnConflictAction::THROW;
	}
	switch (on_conflict->action) {
	case duckdb_libpgquery::PG_ONCONFLICT_NONE:
		return OnConflictAction::THROW;
	case duckdb_libpgquery::PG_ONCONFLICT_NOTHING:
		return OnConflictAction::NOTHING;
	case duckdb_libpgquery::PG_ONCONFLICT_UPDATE:
		return OnConflictAction::UPDATE;
	default:
		throw InternalException("Type not implemented for OnConflictAction");
	}
}